

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmcode.cpp
# Opt level: O0

opcode * __thiscall
assembler::anon_unknown_0::opcode_table::find_opcode
          (opcode *__return_storage_ptr__,opcode_table *this,opcode_operand_type op1,
          opcode_operand_type op2)

{
  anon_class_16_2_441df5ea __comp;
  bool bVar1;
  reference __x;
  logic_error *this_00;
  size_type sVar2;
  reference pvVar3;
  iterator __first;
  iterator __last;
  opcode *op;
  const_iterator __end2;
  const_iterator __begin2;
  vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
  *__range2;
  vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
  matches;
  opcode_operand_type op2_local;
  opcode_operand_type op1_local;
  opcode_table *this_local;
  
  matches.
  super__Vector_base<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = op2;
  matches.
  super__Vector_base<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = op1;
  std::
  vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
  ::vector((vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
            *)&__range2);
  __end2 = std::
           vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
           ::begin(&this->opcodes);
  op = (opcode *)
       std::
       vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
       ::end(&this->opcodes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_assembler::(anonymous_namespace)::opcode_*,_std::vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>_>
                                *)&op);
    if (!bVar1) break;
    __x = __gnu_cxx::
          __normal_iterator<const_assembler::(anonymous_namespace)::opcode_*,_std::vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>_>
          ::operator*(&__end2);
    if ((((__x->operand_1 &
          matches.
          super__Vector_base<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) != none) ||
        (__x->operand_1 ==
         matches.
         super__Vector_base<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)) &&
       (((__x->operand_2 &
         (opcode_operand_type)
         matches.
         super__Vector_base<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage) != none ||
        (__x->operand_2 ==
         (opcode_operand_type)
         matches.
         super__Vector_base<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage)))) {
      std::
      vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
      ::push_back((vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
                   *)&__range2,__x);
    }
    __gnu_cxx::
    __normal_iterator<const_assembler::(anonymous_namespace)::opcode_*,_std::vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>_>
    ::operator++(&__end2);
  }
  bVar1 = std::
          vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
          ::empty((vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
                   *)&__range2);
  if (!bVar1) {
    sVar2 = std::
            vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
            ::size((vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
                    *)&__range2);
    if (sVar2 == 1) {
      pvVar3 = std::
               vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
               ::front((vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
                        *)&__range2);
      opcode::opcode(__return_storage_ptr__,pvVar3);
    }
    else {
      __first = std::
                vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
                ::begin((vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
                         *)&__range2);
      __last = std::
               vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
               ::end((vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
                      *)&__range2);
      __comp.op2 = (opcode_operand_type *)
                   &matches.
                    super__Vector_base<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      __comp.op1 = (opcode_operand_type *)
                   ((long)&matches.
                           super__Vector_base<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
      std::
      sort<__gnu_cxx::__normal_iterator<assembler::(anonymous_namespace)::opcode*,std::vector<assembler::(anonymous_namespace)::opcode,std::allocator<assembler::(anonymous_namespace)::opcode>>>,assembler::(anonymous_namespace)::opcode_table::find_opcode(assembler::(anonymous_namespace)::opcode::opcode_operand_type,assembler::(anonymous_namespace)::opcode::opcode_operand_type)const::_lambda(assembler::(anonymous_namespace)::opcode_const&,assembler::(anonymous_namespace)::opcode_const&)_1_>
                ((__normal_iterator<assembler::(anonymous_namespace)::opcode_*,_std::vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>_>
                  )__first._M_current,
                 (__normal_iterator<assembler::(anonymous_namespace)::opcode_*,_std::vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>_>
                  )__last._M_current,__comp);
      pvVar3 = std::
               vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
               ::front((vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
                        *)&__range2);
      opcode::opcode(__return_storage_ptr__,pvVar3);
    }
    std::
    vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
    ::~vector((vector<assembler::(anonymous_namespace)::opcode,_std::allocator<assembler::(anonymous_namespace)::opcode>_>
               *)&__range2);
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"opcode_table: not available");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

opcode find_opcode(opcode::opcode_operand_type op1, opcode::opcode_operand_type op2) const
      {
      //auto it = std::find_if(opcodes.begin(), opcodes.end(), [&](const opcode& op) { return ((op.operand_1 & op1) == op.operand_1) && ((op.operand_2 & op2) == op.operand_2); });

      std::vector<opcode> matches;
      for (const auto& op : opcodes)
        {
        //if (((op.operand_1 & op1) == op.operand_1) && ((op.operand_2 & op2) == op.operand_2))
        //  matches.push_back(op);
        if (((op.operand_1 & op1) || (op.operand_1 == op1)) && ((op.operand_2 & op2) || (op.operand_2 == op2)))
          matches.push_back(op);
        }

      if (matches.empty())
        throw std::logic_error("opcode_table: not available");

      if (matches.size() == 1)
        return matches.front();

      /*
      For now this sorting works.
      Alternatively: Fill buffer for all matches, and choose shortest one.
      */
      std::sort(matches.begin(), matches.end(), [&](const opcode& op_left, const opcode& op_right)
        {
        uint64_t ham_left_1 = hamming_distance(op_left.operand_1, op1);
        uint64_t ham_left_2 = hamming_distance(op_left.operand_2, op2);
        uint64_t ham_right_1 = hamming_distance(op_right.operand_1, op1);
        uint64_t ham_right_2 = hamming_distance(op_right.operand_2, op2);
        uint64_t val_left = ham_left_1 + ham_left_2 * 64;
        uint64_t val_right = ham_right_1 + ham_right_2 * 64;
        if (val_left == val_right)
          {
          val_left = op_left.operand_1 + op_left.operand_2 * 0x100000;
          val_right = op_right.operand_1 + op_right.operand_2 * 0x100000;
          }
        return val_left < val_right;
        });

      return matches.front();

      }